

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Bitmask whereOmitNoopJoin(WhereInfo *pWInfo,Bitmask notReady)

{
  int iVar1;
  WhereLoop *pWVar2;
  ulong uVar3;
  bool bVar4;
  Bitmask BVar5;
  Bitmask BVar6;
  WhereTerm *pWVar7;
  WhereTerm *pWVar8;
  ulong uVar9;
  WhereTerm *pWVar10;
  byte bVar11;
  
  BVar5 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,pWInfo->pResultSet);
  if (pWInfo->pOrderBy != (ExprList *)0x0) {
    BVar6 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,pWInfo->pOrderBy);
    BVar5 = BVar5 | BVar6;
  }
  bVar11 = pWInfo->nLevel;
  uVar9 = (ulong)bVar11;
  BVar6 = 0xffffffffffffffff;
  if (1 < uVar9) {
    do {
      pWVar2 = pWInfo->a[uVar9 - 1].pWLoop;
      if (((pWInfo->pTabList->a[pWVar2->iTab].fg.jointype & 0x18) == 8) &&
         ((((pWInfo->wctrlFlags & 0x100) != 0 || ((pWVar2->wsFlags & 0x1000) != 0)) &&
          (uVar3 = pWVar2->maskSelf, (uVar3 & BVar5) == 0)))) {
        iVar1 = (pWInfo->sWC).nTerm;
        if (0 < (long)iVar1) {
          pWVar7 = (pWInfo->sWC).a;
          pWVar8 = pWVar7 + iVar1;
          pWVar10 = pWVar7;
          do {
            if (((pWVar10->prereqAll & uVar3) != 0) &&
               (((pWVar10->pExpr->flags & 1) == 0 ||
                ((pWVar10->pExpr->w).iJoin != pWInfo->pTabList->a[pWVar2->iTab].iCursor))))
            goto LAB_0019d9ce;
            pWVar10 = pWVar10 + 1;
          } while (pWVar10 < pWVar8);
          if (0 < iVar1) {
            do {
              if ((pWVar7->prereqAll & uVar3) != 0) {
                *(byte *)&pWVar7->wtFlags = (byte)pWVar7->wtFlags | 4;
              }
              pWVar7 = pWVar7 + 1;
            } while (pWVar7 < pWVar8);
          }
        }
        if (uVar9 != bVar11) {
          memmove(pWInfo->a + (uVar9 - 1),pWInfo->a + uVar9,
                  (long)((ulong)((uint)bVar11 - (int)uVar9) * 0x7000000000) >> 0x20);
          bVar11 = pWInfo->nLevel;
        }
        BVar6 = BVar6 & ~uVar3;
        bVar11 = bVar11 - 1;
        pWInfo->nLevel = bVar11;
      }
LAB_0019d9ce:
      bVar4 = 2 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar4);
  }
  return BVar6;
}

Assistant:

static SQLITE_NOINLINE Bitmask whereOmitNoopJoin(
  WhereInfo *pWInfo,
  Bitmask notReady
){
  int i;
  Bitmask tabUsed;

  /* Preconditions checked by the caller */
  assert( pWInfo->nLevel>=2 );
  assert( OptimizationEnabled(pWInfo->pParse->db, SQLITE_OmitNoopJoin) );

  /* These two preconditions checked by the caller combine to guarantee
  ** condition (1) of the header comment */
  assert( pWInfo->pResultSet!=0 );
  assert( 0==(pWInfo->wctrlFlags & WHERE_AGG_DISTINCT) );

  tabUsed = sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pResultSet);
  if( pWInfo->pOrderBy ){
    tabUsed |= sqlite3WhereExprListUsage(&pWInfo->sMaskSet, pWInfo->pOrderBy);
  }
  for(i=pWInfo->nLevel-1; i>=1; i--){
    WhereTerm *pTerm, *pEnd;
    SrcItem *pItem;
    WhereLoop *pLoop;
    pLoop = pWInfo->a[i].pWLoop;
    pItem = &pWInfo->pTabList->a[pLoop->iTab];
    if( (pItem->fg.jointype & (JT_LEFT|JT_RIGHT))!=JT_LEFT ) continue;
    if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)==0
     && (pLoop->wsFlags & WHERE_ONEROW)==0
    ){
      continue;
    }
    if( (tabUsed & pLoop->maskSelf)!=0 ) continue;
    pEnd = pWInfo->sWC.a + pWInfo->sWC.nTerm;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        if( !ExprHasProperty(pTerm->pExpr, EP_OuterON)
         || pTerm->pExpr->w.iJoin!=pItem->iCursor
        ){
          break;
        }
      }
    }
    if( pTerm<pEnd ) continue;
    WHERETRACE(0xffff, ("-> drop loop %c not used\n", pLoop->cId));
    notReady &= ~pLoop->maskSelf;
    for(pTerm=pWInfo->sWC.a; pTerm<pEnd; pTerm++){
      if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
        pTerm->wtFlags |= TERM_CODED;
      }
    }
    if( i!=pWInfo->nLevel-1 ){
      int nByte = (pWInfo->nLevel-1-i) * sizeof(WhereLevel);
      memmove(&pWInfo->a[i], &pWInfo->a[i+1], nByte);
    }
    pWInfo->nLevel--;
    assert( pWInfo->nLevel>0 );
  }
  return notReady;
}